

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
fmt::v5::format<char[256],char>(char (*format_str) [256],char *args)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  in_stack_00000220;
  basic_string_view<char> in_stack_00000230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  
  this = in_RDI;
  to_string_view<char>((char *)0x2225a9);
  internal::checked_args<char[256],_char>::checked_args
            ((checked_args<char[256],_char> *)this,(char (*) [256])in_RDI,(char *)0x2225c7);
  internal::checked_args<char[256],_char>::operator*((checked_args<char[256],_char> *)0x2225d1);
  internal::vformat<char>(in_stack_00000230,in_stack_00000220);
  return this;
}

Assistant:

inline std::basic_string<FMT_CHAR(S)> format(
    const S &format_str, const Args &... args) {
  return internal::vformat(
    to_string_view(format_str),
    *internal::checked_args<S, Args...>(format_str, args...));
}